

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeDelete(Vdbe *p)

{
  sqlite3 *db_00;
  sqlite3 *db;
  Vdbe *p_local;
  
  if (p != (Vdbe *)0x0) {
    db_00 = p->db;
    sqlite3VdbeClearObject(db_00,p);
    if (p->pPrev == (Vdbe *)0x0) {
      db_00->pVdbe = p->pNext;
    }
    else {
      p->pPrev->pNext = p->pNext;
    }
    if (p->pNext != (Vdbe *)0x0) {
      p->pNext->pPrev = p->pPrev;
    }
    p->magic = 0xb606c3c8;
    p->db = (sqlite3 *)0x0;
    sqlite3DbFree(db_00,p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeDelete(Vdbe *p){
  sqlite3 *db;

  if( NEVER(p==0) ) return;
  db = p->db;
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3VdbeClearObject(db, p);
  if( p->pPrev ){
    p->pPrev->pNext = p->pNext;
  }else{
    assert( db->pVdbe==p );
    db->pVdbe = p->pNext;
  }
  if( p->pNext ){
    p->pNext->pPrev = p->pPrev;
  }
  p->magic = VDBE_MAGIC_DEAD;
  p->db = 0;
  sqlite3DbFree(db, p);
}